

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

void aom_noise_model_save_latest(aom_noise_model_t *noise_model)

{
  undefined4 uVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x150; lVar2 = lVar2 + 0x70) {
    equation_system_copy
              ((aom_equation_system_t *)((long)&noise_model->combined_state[0].eqns.A + lVar2),
               (aom_equation_system_t *)((long)&noise_model->latest_state[0].eqns.A + lVar2));
    equation_system_copy
              ((aom_equation_system_t *)
               ((long)&noise_model->combined_state[0].strength_solver.eqns.A + lVar2),
               (aom_equation_system_t *)
               ((long)&noise_model->latest_state[0].strength_solver.eqns.A + lVar2));
    uVar1 = *(undefined4 *)((long)&noise_model->latest_state[0].num_observations + lVar2);
    *(undefined4 *)((long)&noise_model->combined_state[0].strength_solver.num_equations + lVar2) =
         *(undefined4 *)((long)&noise_model->latest_state[0].strength_solver.num_equations + lVar2);
    *(undefined4 *)((long)&noise_model->combined_state[0].num_observations + lVar2) = uVar1;
    *(undefined8 *)((long)&noise_model->combined_state[0].ar_gain + lVar2) =
         *(undefined8 *)((long)&noise_model->latest_state[0].ar_gain + lVar2);
  }
  return;
}

Assistant:

void aom_noise_model_save_latest(aom_noise_model_t *noise_model) {
  for (int c = 0; c < 3; c++) {
    equation_system_copy(&noise_model->combined_state[c].eqns,
                         &noise_model->latest_state[c].eqns);
    equation_system_copy(&noise_model->combined_state[c].strength_solver.eqns,
                         &noise_model->latest_state[c].strength_solver.eqns);
    noise_model->combined_state[c].strength_solver.num_equations =
        noise_model->latest_state[c].strength_solver.num_equations;
    noise_model->combined_state[c].num_observations =
        noise_model->latest_state[c].num_observations;
    noise_model->combined_state[c].ar_gain =
        noise_model->latest_state[c].ar_gain;
  }
}